

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

uint64_t __thiscall
google::protobuf::internal::ThreadSafeArena::SpaceAllocated(ThreadSafeArena *this)

{
  long lVar1;
  bool bVar2;
  __pointer_type this_00;
  long lVar3;
  uint64_t uVar4;
  Span<const_std::atomic<google::protobuf::internal::SerialArena_*>_> SVar5;
  
  uVar4 = (this->first_arena_).space_allocated_.super___atomic_base<unsigned_long>._M_i;
  this_00 = (this->head_)._M_b._M_p;
  while( true ) {
    bVar2 = SerialArenaChunk::IsSentry(this_00);
    if (bVar2) break;
    SerialArenaChunk::next_chunk(this_00);
    SVar5 = SerialArenaChunk::arenas(this_00);
    for (lVar3 = 0; SVar5.len_ * 8 != lVar3; lVar3 = lVar3 + 8) {
      lVar1 = *(long *)((long)&((SVar5.ptr_)->_M_b)._M_p + lVar3);
      if (lVar1 != 0) {
        uVar4 = uVar4 + *(long *)(lVar1 + 0x58);
      }
    }
    this_00 = SerialArenaChunk::next_chunk(this_00);
  }
  return uVar4;
}

Assistant:

bool insert(void* me, SerialArena* serial) {
    uint32_t idx = size().fetch_add(1, std::memory_order_relaxed);
    // Bail out if this chunk is full.
    if (idx >= capacity()) {
      // Write old value back to avoid potential overflow.
      size().store(capacity(), std::memory_order_relaxed);
      return false;
    }

    id(idx).store(me, std::memory_order_relaxed);
    arena(idx).store(serial, std::memory_order_release);
    return true;
  }